

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O2

Error asmjit::v1_14::x86::FormatterInternal::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  char c;
  uint uVar1;
  Error EVar2;
  ulong uVar3;
  uint32_t uVar4;
  char *pcVar5;
  FormatFlags formatFlags_00;
  ulong uVar6;
  StringFormatFlags flags;
  char cVar7;
  
  uVar1 = (op->_signature)._bits;
  switch(uVar1 & 7) {
  case 1:
    EVar2 = formatRegister(sb,formatFlags,emitter,kUnknown,(byte)uVar1 >> 3,op->_baseId);
    return EVar2;
  case 2:
    break;
  default:
    EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar2;
  case 4:
    uVar6 = *(ulong *)op->_data;
    if (((formatFlags & kHexImms) == kNone) || (uVar6 < 10)) {
      uVar4 = 10;
      flags = kSigned;
    }
    else {
      EVar2 = String::_opString(sb,kAppend,"0x",2);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar4 = 0x10;
      flags = kNone;
    }
    EVar2 = String::_opNumber(sb,kAppend,uVar6,uVar4,0,flags);
    return EVar2;
  case 5:
    EVar2 = Formatter::formatLabel(sb,formatFlags,emitter,op->_baseId);
    return EVar2;
  }
  uVar1 = uVar1 >> 0x18;
  switch(uVar1) {
  case 1:
    pcVar5 = "byte ptr ";
    break;
  case 2:
    pcVar5 = "word ptr ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_0013e742_caseD_3:
    pcVar5 = "";
    break;
  case 4:
    pcVar5 = "dword ptr ";
    break;
  case 6:
    pcVar5 = "fword ptr ";
    break;
  case 8:
    pcVar5 = "qword ptr ";
    break;
  case 10:
    pcVar5 = "tbyte ptr ";
    break;
  case 0x10:
    pcVar5 = "xmmword ptr ";
    break;
  default:
    if (uVar1 == 0x20) {
      pcVar5 = "ymmword ptr ";
    }
    else {
      if (uVar1 != 0x40) goto switchD_0013e742_caseD_3;
      pcVar5 = "zmmword ptr ";
    }
  }
  EVar2 = String::_opString(sb,kAppend,pcVar5,0xffffffffffffffff);
  if (EVar2 != 0) {
    return EVar2;
  }
  if ((((op->_signature)._bits >> 0x12 & 7) - 1 < 6) &&
     (EVar2 = String::_opFormat(sb,kAppend,"%s:"), EVar2 != 0)) {
    return EVar2;
  }
  EVar2 = String::_opChar(sb,kAppend,'[');
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = (op->_signature)._bits >> 0xe & 3;
  if (uVar1 == 2) {
    pcVar5 = "rel ";
LAB_0013e890:
    EVar2 = String::_opString(sb,kAppend,pcVar5,0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  else if (uVar1 == 1) {
    pcVar5 = "abs ";
    goto LAB_0013e890;
  }
  uVar1 = (op->_signature)._bits;
  uVar6 = (ulong)uVar1;
  if ((uVar1 & 0xf8) == 0) {
    if ((uVar1 & 0x1f00) != 0) goto LAB_0013e8de;
    cVar7 = '\0';
  }
  else {
    if ((uVar1 & 0xf8) == 8) {
      EVar2 = Formatter::formatLabel(sb,formatFlags,emitter,op->_baseId);
    }
    else {
      formatFlags_00 = formatFlags;
      if ((uVar1 >> 0xd & 1) != 0) {
        EVar2 = String::_opString(sb,kAppend,"&",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        formatFlags_00 = formatFlags & ~kRegCasts;
        uVar6 = (ulong)(byte)(op->_signature)._bits;
      }
      EVar2 = formatRegister(sb,formatFlags_00,emitter,kUnknown,(RegType)(uVar6 >> 3) & kMaxValue,
                             op->_baseId);
    }
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar1 = (op->_signature)._bits;
    uVar6 = (ulong)uVar1;
    if ((uVar1 & 0x1f00) == 0) {
      cVar7 = '+';
    }
    else {
      EVar2 = String::_opChar(sb,kAppend,'+');
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar1 = (op->_signature)._bits;
LAB_0013e8de:
      EVar2 = formatRegister(sb,formatFlags,emitter,kUnknown,(RegType)(uVar1 >> 8) & kMaxValue,
                             op->_data[0]);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar1 = (op->_signature)._bits;
      uVar6 = (ulong)uVar1;
      cVar7 = '+';
      if ((uVar1 & 0x30000) != 0) {
        EVar2 = String::_opFormat(sb,kAppend,"*%u",(ulong)(uint)(1 << ((byte)(uVar1 >> 0x10) & 3)));
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar6 = (ulong)(op->_signature)._bits;
      }
    }
  }
  uVar3 = CONCAT44(op->_baseId,op->_data[1]);
  if ((uVar6 & 0xf8) != 0) {
    uVar3 = (long)(int)op->_data[1];
  }
  if (((uVar6 & 0x1ff8) != 0) && (uVar3 == 0)) {
LAB_0013e9f0:
    EVar2 = String::_opChar(sb,kAppend,']');
    return EVar2;
  }
  uVar6 = -uVar3;
  if (0 < (long)uVar3) {
    uVar6 = uVar3;
  }
  c = '-';
  if (-1 < (long)uVar3) {
    c = cVar7;
  }
  if ((c == '\0') || (EVar2 = String::_opChar(sb,kAppend,c), EVar2 == 0)) {
    uVar4 = 10;
    if (((formatFlags & kHexOffsets) != kNone) && (9 < uVar6)) {
      EVar2 = String::_opString(sb,kAppend,"0x",2);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar4 = 0x10;
    }
    EVar2 = String::_opNumber(sb,kAppend,uVar6,uVar4,0,kNone);
    if (EVar2 == 0) goto LAB_0013e9f0;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg())
    return formatRegister(sb, formatFlags, emitter, arch, op.as<BaseReg>().type(), op.as<BaseReg>().id());

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append(x86GetAddressSizeString(m.size())));

    // Segment override prefix.
    uint32_t seg = m.segmentId();
    if (seg != SReg::kIdNone && seg < SReg::kIdCount)
      ASMJIT_PROPAGATE(sb.appendFormat("%s:", x86RegFormatInfo.nameStrings + 224 + size_t(seg) * 4));

    ASMJIT_PROPAGATE(sb.append('['));
    switch (m.addrType()) {
      case Mem::AddrType::kDefault:
        break;
      case Mem::AddrType::kAbs:
        ASMJIT_PROPAGATE(sb.append("abs "));
        break;
      case Mem::AddrType::kRel:
        ASMJIT_PROPAGATE(sb.append("rel "));
        break;
    }

    char opSign = '\0';
    if (m.hasBase()) {
      opSign = '+';
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, formatFlags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = formatFlags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append("&"));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }

    if (m.hasIndex()) {
      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      opSign = '+';
      ASMJIT_PROPAGATE(formatRegister(sb, formatFlags, emitter, arch, m.indexType(), m.indexId()));
      if (m.hasShift())
        ASMJIT_PROPAGATE(sb.appendFormat("*%u", 1 << m.shift()));
    }

    uint64_t off = uint64_t(m.offset());
    if (off || !m.hasBaseOrIndex()) {
      if (int64_t(off) < 0) {
        opSign = '-';
        off = ~off + 1;
      }

      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      uint32_t base = 10;
      if (Support::test(formatFlags, FormatFlags::kHexOffsets) && off > 9) {
        ASMJIT_PROPAGATE(sb.append("0x", 2));
        base = 16;
      }

      ASMJIT_PROPAGATE(sb.appendUInt(off, base));
    }

    return sb.append(']');
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();

    if (Support::test(formatFlags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x", 2));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, formatFlags, emitter, op.id());
  }

  return sb.append("<None>");
}